

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void anon_unknown.dwarf_26ba73::PulseMainloop::streamStateCallbackC(pa_stream *stream,void *pdata)

{
  int iVar1;
  
  iVar1 = (*(anonymous_namespace)::ppa_stream_get_state)();
  if (iVar1 == 1) {
    return;
  }
  std::condition_variable::notify_all();
  return;
}

Assistant:

static void streamStateCallbackC(pa_stream *stream, void *pdata) noexcept
    { static_cast<PulseMainloop*>(pdata)->streamStateCallback(stream); }